

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throttle.cpp
# Opt level: O0

void throttle_copy(Metric *src,Metric *dst,Duration cooldown_period,Duration chunk_interval)

{
  TimeValue tv_00;
  bool bVar1;
  size_t sVar2;
  rep rVar3;
  rep rVar4;
  reference pTVar5;
  ulong uVar6;
  ostream *poVar7;
  void *pvVar8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_f0;
  duration local_e8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tStack_d0;
  TimeValue tv;
  iterator __end2;
  iterator __begin2;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__range2;
  base local_a0;
  duration local_98;
  duration local_90;
  undefined1 local_88 [8];
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_60;
  time_point t0;
  TimePoint previous_time;
  size_t count;
  size_t written;
  size_t read;
  pair<hta::Clock::time_point,_hta::Clock::time_point> total_range;
  Metric *dst_local;
  Metric *src_local;
  Duration chunk_interval_local;
  Duration cooldown_period_local;
  
  total_range.second.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)dst;
  src_local = (Metric *)chunk_interval.__r;
  chunk_interval_local = cooldown_period;
  _read = hta::Metric::range(src);
  written = 0;
  count = 0;
  sVar2 = hta::Metric::count(src);
  hta::Clock::time_point::time_point(&t0);
  local_60.__d.__r = (duration)(duration)read;
  while (bVar1 = std::chrono::operator<=
                           (&local_60,
                            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&total_range), bVar1) {
    local_68.__r = (rep)std::chrono::operator-
                                  (&local_60,
                                   (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&read);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_68);
    data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::chrono::operator-
                            ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&total_range,
                             (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&read);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       &data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    print_progress((double)rVar3 / (double)rVar4);
    local_90 = local_60.__d.__r;
    local_a0.__d.__r =
         (duration)
         std::chrono::operator+
                   (&local_60,(duration<long,_std::ratio<1L,_1000000000L>_> *)&src_local);
    hta::Clock::time_point::time_point((time_point *)&local_98,&local_a0);
    hta::Metric::retrieve
              ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_88,src,
               (TimePoint)local_90.__r,(TimePoint)local_98.__r,(IntervalScope)0x1);
    __end2 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::begin
                       ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_88);
    tv.value = (Value)std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::end
                                ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_88
                                );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                                       *)&tv.value), bVar1) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ::operator*(&__end2);
      tStack_d0.__d.__r =
           (duration)
           (pTVar5->time).
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      tv.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            pTVar5->value;
      uVar6 = written + 1;
      if ((uVar6 % 100000000 == 0) || (uVar6 == sVar2)) {
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar6);
        poVar7 = std::operator<<(poVar7," / ");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,sVar2);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::chrono::operator<=
                        (&tStack_d0,
                         &t0.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        );
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Non-Monotonic time ");
        local_e8 = tStack_d0.__d.__r;
        poVar7 = hta::operator<<(poVar7,(TimePoint)tStack_d0.__d.__r);
        poVar7 = std::operator<<(poVar7," at index ");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,written);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_f0 = std::chrono::operator+
                             (&t0.
                               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              ,&chunk_interval_local);
        bVar1 = std::chrono::operator<(&local_f0,&tStack_d0);
        if (bVar1) {
          t0.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       )tStack_d0.__d.__r;
          tv_00.value = (Value)tv.time.
                               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               .__d.__r;
          tv_00.time.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       )tStack_d0.__d.__r;
          hta::Metric::insert((Metric *)
                              total_range.second.
                              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              .__d.__r,tv_00);
          count = count + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
      ::operator++(&__end2);
      written = uVar6;
    }
    std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~vector
              ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_88);
    std::chrono::time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator+=(&local_60,(duration *)&src_local);
  }
  print_progress(1.0);
  poVar7 = std::operator<<((ostream *)&std::cout,"completed, read: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,written);
  poVar7 = std::operator<<(poVar7,", written: ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,count);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void throttle_copy(hta::Metric& src, hta::Metric& dst, hta::Duration cooldown_period,
                   hta::Duration chunk_interval = hta::duration_cast(std::chrono::hours(30 * 24)))
{
    auto total_range = src.range();
    size_t read = 0, written = 0;
    auto count = src.count();
    hta::TimePoint previous_time;
    for (auto t0 = total_range.first; t0 <= total_range.second; t0 += chunk_interval)
    {
        print_progress(static_cast<double>((t0 - total_range.first).count()) /
                       (total_range.second - total_range.first).count());
        auto data = src.retrieve(t0, t0 + chunk_interval, { hta::Scope::closed, hta::Scope::open });
        for (auto tv : data)
        {
            read++;
            if (read % 100000000 == 0 || read == count)
            {
                std::cout << read << " / " << count << std::endl;
            }
            if (tv.time <= previous_time)
            {
                std::cerr << "Non-Monotonic time " << tv.time << " at index " << (read - 1)
                          << std::endl;
                continue;
            }
            if (previous_time + cooldown_period < tv.time)
            {
                previous_time = tv.time;
                dst.insert(tv);
                written++;
            }
        }
    }
    print_progress(1);
    std::cout << "completed, read: " << read << ", written: " << written << std::endl;
}